

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O1

void __thiscall ipx::Basis::UnfixVariables(Basis *this)

{
  Int *pIVar1;
  int iVar2;
  pointer piVar3;
  uint uVar4;
  ulong uVar5;
  
  iVar2 = this->model_->num_cols_;
  pIVar1 = &this->model_->num_rows_;
  uVar4 = iVar2 + *pIVar1;
  if (uVar4 != 0 && SCARRY4(iVar2,*pIVar1) == (int)uVar4 < 0) {
    piVar3 = (this->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = 0;
    do {
      if (piVar3[uVar5] == -2) {
        piVar3[uVar5] = -1;
      }
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  return;
}

Assistant:

void Basis::UnfixVariables() {
    const Int m = model_.rows();
    const Int n = model_.cols();
    for (Int j = 0; j < n+m; j++)
        if (map2basis_[j] == -2)
            map2basis_[j] = -1;
}